

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O0

void Bmcs_ManPrintFrame(Bmcs_Man_t *p,int f,int nClauses,int Solver,abctime clkStart)

{
  int iVar1;
  abctime aVar2;
  double dVar3;
  double dVar4;
  int fUnfinished;
  abctime clkStart_local;
  int Solver_local;
  int nClauses_local;
  int f_local;
  Bmcs_Man_t *p_local;
  
  if (p->pPars->fVerbose != 0) {
    Abc_Print(1,"%4d %s : ",(ulong)(uint)f,"+");
    iVar1 = satoko_varnum(p->pSats[0]);
    Abc_Print(1,"Var =%8.0f.  ",(double)iVar1);
    iVar1 = satoko_clausenum(p->pSats[0]);
    Abc_Print(1,"Cla =%9.0f.  ",(double)iVar1);
    iVar1 = satoko_learntnum(p->pSats[0]);
    Abc_Print(1,"Learn =%9.0f.  ",(double)iVar1);
    iVar1 = satoko_conflictnum(p->pSats[0]);
    Abc_Print(1,"Conf =%9.0f.  ",(double)iVar1);
    if (1 < p->pPars->nProcs) {
      Abc_Print(1,"S = %3d. ",(ulong)(uint)Solver);
    }
    dVar3 = Gia_ManMemory(p->pFrames);
    dVar4 = Vec_IntMemory(&p->vFr2Sat);
    Abc_Print(1,"%4.0f MB",(((double)(int)dVar3 + dVar4) * 1.0) / 1048576.0);
    aVar2 = Abc_Clock();
    Abc_Print(1,"%9.2f sec  ",(double)((float)(aVar2 - clkStart) / 1e+06));
    printf("\n");
    fflush(_stdout);
  }
  return;
}

Assistant:

void Bmcs_ManPrintFrame( Bmcs_Man_t * p, int f, int nClauses, int Solver, abctime clkStart )
{
    int fUnfinished = 0;
    if ( !p->pPars->fVerbose )
        return;
    Abc_Print( 1, "%4d %s : ", f,   fUnfinished ? "-" : "+" );
#ifndef ABC_USE_EXT_SOLVERS
    Abc_Print( 1, "Var =%8.0f.  ",  (double)satoko_varnum(p->pSats[0]) ); 
    Abc_Print( 1, "Cla =%9.0f.  ",  (double)satoko_clausenum(p->pSats[0]) );  
    Abc_Print( 1, "Learn =%9.0f.  ",(double)satoko_learntnum(p->pSats[0]) );  
    Abc_Print( 1, "Conf =%9.0f.  ", (double)satoko_conflictnum(p->pSats[0]) );  
#else
    Abc_Print( 1, "Var =%8.0f.  ",  (double)p->nSatVars ); 
    Abc_Print( 1, "Cla =%9.0f.  ",  (double)nClauses );  
#endif
    if ( p->pPars->nProcs > 1 )
        Abc_Print( 1, "S = %3d. ",  Solver );
    Abc_Print( 1, "%4.0f MB",       1.0*((int)Gia_ManMemory(p->pFrames) + Vec_IntMemory(&p->vFr2Sat))/(1<<20) );
    Abc_Print( 1, "%9.2f sec  ",    (float)(Abc_Clock() - clkStart)/(float)(CLOCKS_PER_SEC) );
    printf( "\n" );
    fflush( stdout );
}